

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

void __thiscall
Well<unsigned_int,32ul,17ul,23ul,13ul,11ul,10ul,Detail::M3<-13>,Detail::M3<-15>,Detail::M1,Detail::M2<-21>,Detail::M3<-13>,Detail::M2<1>,Detail::M0,Detail::M3<11>,Detail::NoTempering>
::seed<unsigned_int*>
          (Well<unsigned_int,32ul,17ul,23ul,13ul,11ul,10ul,Detail::M3<_13>,Detail::M3<_15>,Detail::M1,Detail::M2<_21>,Detail::M3<_13>,Detail::M2<1>,Detail::M0,Detail::M3<11>,Detail::NoTempering>
           *this,uint **first,uint *last)

{
  invalid_argument *this_00;
  bool bVar1;
  long local_28;
  size_t i;
  uint *last_local;
  uint **first_local;
  Well<unsigned_int,_32UL,_17UL,_23UL,_13UL,_11UL,_10UL,_Detail::M3<_13>,_Detail::M3<_15>,_Detail::M1,_Detail::M2<_21>,_Detail::M3<_13>,_Detail::M2<1>,_Detail::M0,_Detail::M3<11>,_Detail::NoTempering>
  *this_local;
  
  *(undefined8 *)(this + 0x48) = 0;
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if (local_28 != 0x11) {
      bVar1 = *first != last;
    }
    if (!bVar1) break;
    *(uint *)(this + local_28 * 4) = **first;
    local_28 = local_28 + 1;
    *first = *first + 1;
  }
  if ((*first == last) && (local_28 != 0x11)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Seed sequence too short");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        index_ = 0;
        std::size_t i = 0;

        for ( ; i != state_size && first != last; ++i, ++first)
            state_[i] = *first;

        if (first == last && i != state_size)
            throw std::invalid_argument("Seed sequence too short");
    }